

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx512::LineSegmentsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,mvector<PrimRef> *prims,
          size_t itime,range<unsigned_long> *r,size_t k,uint geomID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  PrimRef *pPVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  size_t sVar10;
  ulong uVar11;
  size_t *psVar12;
  ulong uVar13;
  long lVar14;
  size_t sVar15;
  ulong uVar16;
  unsigned_long uVar17;
  ulong uVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  undefined1 auVar26 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  size_t local_60;
  undefined1 auVar21 [64];
  undefined1 auVar23 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar16 = r->_begin;
  uVar17 = r->_end;
  if (uVar16 < uVar17) {
    auVar20._8_4_ = 0xff800000;
    auVar20._0_8_ = 0xff800000ff800000;
    auVar20._12_4_ = 0xff800000;
    auVar21 = ZEXT1664(auVar20);
    auVar22._8_4_ = 0x7f800000;
    auVar22._0_8_ = 0x7f8000007f800000;
    auVar22._12_4_ = 0x7f800000;
    auVar23 = ZEXT1664(auVar22);
    local_60 = 0;
    auVar30._8_4_ = 0xddccb9a2;
    auVar30._0_8_ = 0xddccb9a2ddccb9a2;
    auVar30._12_4_ = 0xddccb9a2;
    auVar31._8_4_ = 0x5dccb9a2;
    auVar31._0_8_ = 0x5dccb9a25dccb9a2;
    auVar31._12_4_ = 0x5dccb9a2;
    auVar26 = ZEXT1664(auVar22);
    auVar29 = ZEXT1664(auVar20);
    do {
      pBVar2 = (this->super_LineSegments).vertices.items;
      uVar1 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                       *(long *)&(this->super_LineSegments).field_0x68 * uVar16);
      uVar18 = (ulong)uVar1;
      uVar13 = (ulong)(uVar1 + 1);
      sVar15 = k;
      if (uVar13 < (pBVar2->super_RawBufferView).num) {
        psVar12 = &pBVar2[itime].super_RawBufferView.stride;
        sVar10 = itime;
        do {
          auVar20 = *(undefined1 (*) [16])
                     (((RawBufferView *)(psVar12 + -2))->ptr_ofs + *psVar12 * uVar18);
          uVar8 = vcmpps_avx512vl(auVar20,auVar30,6);
          uVar9 = vcmpps_avx512vl(auVar20,auVar31,1);
          if ((byte)((byte)uVar8 & (byte)uVar9) != 0xf) goto LAB_01f0ec86;
          auVar22 = *(undefined1 (*) [16])
                     (((RawBufferView *)(psVar12 + -2))->ptr_ofs + *psVar12 * uVar13);
          uVar8 = vcmpps_avx512vl(auVar22,auVar30,6);
          uVar9 = vcmpps_avx512vl(auVar22,auVar31,1);
          if ((byte)((byte)uVar8 & (byte)uVar9) != 0xf) goto LAB_01f0ec86;
          auVar20 = vshufps_avx(auVar20,auVar20,0xff);
          auVar22 = vshufps_avx(auVar22,auVar22,0xff);
          auVar20 = vminss_avx(auVar20,auVar22);
          if (auVar20._0_4_ < 0.0) goto LAB_01f0ec86;
          sVar10 = sVar10 + 1;
          psVar12 = psVar12 + 7;
        } while (sVar10 <= itime);
        psVar12 = &pBVar2[itime + 1].super_RawBufferView.stride;
        uVar11 = itime + 1;
        do {
          auVar20 = *(undefined1 (*) [16])
                     (((RawBufferView *)(psVar12 + -2))->ptr_ofs + *psVar12 * uVar18);
          uVar8 = vcmpps_avx512vl(auVar20,auVar30,6);
          uVar9 = vcmpps_avx512vl(auVar20,auVar31,1);
          if ((byte)((byte)uVar8 & (byte)uVar9) != 0xf) goto LAB_01f0ec86;
          auVar22 = *(undefined1 (*) [16])
                     (((RawBufferView *)(psVar12 + -2))->ptr_ofs + *psVar12 * uVar13);
          uVar8 = vcmpps_avx512vl(auVar22,auVar30,6);
          uVar9 = vcmpps_avx512vl(auVar22,auVar31,1);
          if ((byte)((byte)uVar8 & (byte)uVar9) != 0xf) goto LAB_01f0ec86;
          auVar20 = vshufps_avx(auVar20,auVar20,0xff);
          auVar22 = vshufps_avx(auVar22,auVar22,0xff);
          auVar20 = vminss_avx(auVar20,auVar22);
          if (auVar20._0_4_ < 0.0) goto LAB_01f0ec86;
          uVar11 = uVar11 + 1;
          psVar12 = psVar12 + 7;
        } while (uVar11 <= itime + 1);
        pcVar3 = pBVar2[itime].super_RawBufferView.ptr_ofs;
        sVar15 = pBVar2[itime].super_RawBufferView.stride;
        lVar19 = uVar18 * sVar15;
        lVar14 = uVar13 * sVar15;
        auVar32 = vminps_avx(*(undefined1 (*) [16])(pcVar3 + lVar19),
                             *(undefined1 (*) [16])(pcVar3 + lVar14));
        auVar20 = vmaxps_avx(*(undefined1 (*) [16])(pcVar3 + lVar19),
                             *(undefined1 (*) [16])(pcVar3 + lVar14));
        auVar22 = vmaxss_avx(ZEXT416(*(uint *)(pcVar3 + lVar14 + 0xc)),
                             ZEXT416(*(uint *)(pcVar3 + lVar19 + 0xc)));
        fVar7 = auVar22._0_4_ * (this->super_LineSegments).maxRadiusScale;
        auVar33._4_4_ = fVar7;
        auVar33._0_4_ = fVar7;
        auVar33._8_4_ = fVar7;
        auVar33._12_4_ = fVar7;
        auVar22 = vsubps_avx(auVar32,auVar33);
        aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar22,ZEXT416(geomID),0x30);
        auVar32._0_4_ = auVar20._0_4_ + fVar7;
        auVar32._4_4_ = auVar20._4_4_ + fVar7;
        auVar32._8_4_ = auVar20._8_4_ + fVar7;
        auVar32._12_4_ = auVar20._12_4_ + fVar7;
        aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                vinsertps_avx(auVar32,ZEXT416((uint)uVar16),0x30);
        auVar20 = vminps_avx(auVar23._0_16_,(undefined1  [16])aVar5);
        auVar23 = ZEXT1664(auVar20);
        auVar20 = vmaxps_avx(auVar21._0_16_,(undefined1  [16])aVar6);
        auVar21 = ZEXT1664(auVar20);
        auVar34._0_4_ = aVar5.x + aVar6.x;
        auVar34._4_4_ = aVar5.y + aVar6.y;
        auVar34._8_4_ = aVar5.z + aVar6.z;
        auVar34._12_4_ = aVar5.field_3.w + aVar6.field_3.w;
        auVar20 = vminps_avx(auVar26._0_16_,auVar34);
        auVar26 = ZEXT1664(auVar20);
        auVar20 = vmaxps_avx(auVar29._0_16_,auVar34);
        auVar29 = ZEXT1664(auVar20);
        local_60 = local_60 + 1;
        sVar15 = k + 1;
        pPVar4 = prims->items;
        pPVar4[k].upper.field_0.field_1 = aVar6;
        pPVar4[k].lower.field_0.field_1 = aVar5;
        uVar17 = r->_end;
      }
LAB_01f0ec86:
      aVar27 = auVar29._0_16_;
      aVar24 = auVar26._0_16_;
      aVar28 = auVar21._0_16_;
      aVar25 = auVar23._0_16_;
      uVar16 = uVar16 + 1;
      k = sVar15;
    } while (uVar16 < uVar17);
  }
  else {
    aVar25.m128[2] = INFINITY;
    aVar25._0_8_ = 0x7f8000007f800000;
    aVar25.m128[3] = INFINITY;
    aVar28.m128[2] = -INFINITY;
    aVar28._0_8_ = 0xff800000ff800000;
    aVar28.m128[3] = -INFINITY;
    local_60 = 0;
    aVar24 = aVar25;
    aVar27 = aVar28;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar25;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar28;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar24;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar27;
  __return_storage_ptr__->end = local_60;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,itime,bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }